

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpsession.cpp
# Opt level: O0

int __thiscall jrtplib::RTPSession::SetSessionBandwidth(RTPSession *this,double bw)

{
  undefined1 local_48 [8];
  RTCPSchedulerParams p;
  int status;
  double bw_local;
  RTPSession *this_local;
  
  if ((this->created & 1U) == 0) {
    this_local._4_4_ = -0x3e;
  }
  else {
    RTCPScheduler::GetParameters((RTCPSchedulerParams *)local_48,&this->rtcpsched);
    p._28_4_ = RTCPSchedulerParams::SetRTCPBandwidth
                         ((RTCPSchedulerParams *)local_48,bw * this->controlfragment);
    if (-1 < (int)p._28_4_) {
      RTCPScheduler::SetParameters(&this->rtcpsched,(RTCPSchedulerParams *)local_48);
      this->sessionbandwidth = bw;
    }
    this_local._4_4_ = p._28_4_;
    RTCPSchedulerParams::~RTCPSchedulerParams((RTCPSchedulerParams *)local_48);
  }
  return this_local._4_4_;
}

Assistant:

int RTPSession::SetSessionBandwidth(double bw)
{
	if (!created)
		return ERR_RTP_SESSION_NOTCREATED;

	int status;
	SCHED_LOCK
	RTCPSchedulerParams p = rtcpsched.GetParameters();
	status = p.SetRTCPBandwidth(bw*controlfragment);
	if (status >= 0)
	{
		rtcpsched.SetParameters(p);
		sessionbandwidth = bw;
	}
	SCHED_UNLOCK
	return status;
}